

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

bool __thiscall rw::Camera::streamWrite(Camera *this,Stream *stream)

{
  uint32 size;
  V2d local_38;
  V2d VStack_30;
  undefined8 local_28;
  float32 local_20;
  int32 local_1c;
  
  size = streamGetSize(this);
  writeChunkHeader(stream,5,size);
  writeChunkHeader(stream,1,0x20);
  local_38 = this->viewWindow;
  VStack_30 = this->viewOffset;
  local_28._0_4_ = this->nearPlane;
  local_28._4_4_ = this->farPlane;
  local_20 = this->fogPlane;
  local_1c = this->projection;
  Stream::write32(stream,&local_38,0x20);
  PluginList::streamWrite((PluginList *)&s_plglist,stream,this);
  return true;
}

Assistant:

bool
Camera::streamWrite(Stream *stream)
{
	CameraChunkData buf;
	writeChunkHeader(stream, ID_CAMERA, this->streamGetSize());
	writeChunkHeader(stream, ID_STRUCT, sizeof(CameraChunkData));
	buf.viewWindow = this->viewWindow;
	buf.viewOffset = this->viewOffset;
	buf.nearPlane = this->nearPlane;
	buf.farPlane  = this->farPlane;
	buf.fogPlane = this->fogPlane;
	buf.projection = this->projection;
	stream->write32(&buf, sizeof(CameraChunkData));
	s_plglist.streamWrite(stream, this);
	return true;
}